

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::FormulasLoader::end__formula(FormulasLoader *this)

{
  FilePartLoader *pFVar1;
  HelperLoaderBase *in_RDI;
  Formula *in_stack_00000048;
  DocumentProcessor *in_stack_00000050;
  
  pFVar1 = HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  (*(pFVar1->super_IFilePartLoader).super_ExtraDataLoader._vptr_ExtraDataLoader[2])();
  DocumentProcessor::addFormula(in_stack_00000050,in_stack_00000048);
  in_RDI[1]._vptr_HelperLoaderBase = (_func_int **)0x0;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  IFilePartLoader::moveUpInSidTree((IFilePartLoader *)0xb2646c);
  return true;
}

Assistant:

bool FormulasLoader::end__formula()
	{
		getHandlingFilePartLoader()->getFileLoader()->addFormula( mCurrentFormula );
		mCurrentFormula = 0;
		getHandlingFilePartLoader()->moveUpInSidTree();

		return true;
	}